

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::BitCountCase::compare(BitCountCase *this,void **inputs,void **outputs)

{
  char cVar1;
  int iVar2;
  pointer pSVar3;
  uint uVar4;
  ostream *poVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ostringstream *this_00;
  ulong uVar10;
  bool bVar11;
  
  pSVar3 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cVar1 = (&DAT_01c5ce10)[(ulong)(pSVar3->varType).m_data.basic.precision * 4];
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (0 < (int)uVar4) {
    uVar10 = 0;
    bVar11 = false;
    do {
      uVar6 = *(uint *)((long)*inputs + uVar10 * 4);
      iVar2 = *(int *)((long)*outputs + uVar10 * 4);
      uVar8 = uVar6 & (2 << (cVar1 - 1U & 0x1f)) - 1U;
      uVar8 = (uVar8 >> 1 & 0x55555555) + (uVar8 & 0x55555555);
      uVar8 = (uVar8 >> 2 & 0x33333333) + (uVar8 & 0x33333333);
      uVar8 = (uVar8 >> 4 & 0x7070707) + (uVar8 & 0x7070707);
      uVar8 = (uVar8 >> 8 & 0xf000f) + (uVar8 & 0xf000f);
      iVar9 = (uVar8 >> 0x10) + (uVar8 & 0xff);
      uVar6 = (uVar6 >> 1 & 0x55555555) + (uVar6 & 0x55555555);
      uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
      uVar6 = (uVar6 >> 4 & 0x7070707) + (uVar6 & 0x7070707);
      uVar6 = (uVar6 >> 8 & 0xf000f) + (uVar6 & 0xf000f);
      iVar7 = (uVar6 >> 0x10) + (uVar6 & 0xff);
      if ((iVar7 < iVar2) || (iVar2 < iVar9)) {
        this_00 = &(this->super_IntegerFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar5 = (ostream *)std::ostream::operator<<(this_00,(int)uVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] in range [",0xc);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
        return bVar11;
      }
      uVar10 = uVar10 + 1;
      bVar11 = uVar4 <= uVar10;
    } while (uVar10 != uVar4);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const deUint32			countMask		= getLowBitMask(integerLength);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const int		out		= ((const int*)outputs[0])[compNdx];
			const int		minRef	= dePop32(value&countMask);
			const int		maxRef	= dePop32(value);

			if (!de::inRange(out, minRef, maxRef))
			{
				m_failMsg << "Expected [" << compNdx << "] in range [" << minRef << ", " << maxRef << "]";
				return false;
			}
		}

		return true;
	}